

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O2

void anon_unknown.dwarf_47fb2::test(_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  float fVar1;
  int iVar2;
  ostream *poVar3;
  Vec3<float> *pVVar4;
  int i;
  uint uVar5;
  int j_1;
  int k;
  long lVar6;
  int j;
  long lVar7;
  int k_1;
  uint uVar8;
  uint uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Rand48 r;
  M44f M;
  Euler<float> local_148;
  double local_138;
  double local_128;
  double local_110;
  ulong local_108;
  double local_100;
  Vec3<float> local_f8;
  float fStack_ec;
  float local_e8 [2];
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8 [2];
  float afStack_c0 [2];
  M44f local_b8;
  M44f local_78;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"order = ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,order);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar3);
  local_148.super_Vec3<float>.x = 1.5365222e+16;
  local_148.super_Vec3<float>.y = (float)CONCAT22(local_148.super_Vec3<float>.y._2_2_,0x5a5a);
  for (iVar2 = 0; iVar2 != 100000; iVar2 = iVar2 + 1) {
    local_128 = Imath_2_5::Rand48::nextf((Rand48 *)&local_148,-180.0,180.0);
    local_138 = Imath_2_5::Rand48::nextf((Rand48 *)&local_148,-180.0,180.0);
    dVar10 = Imath_2_5::Rand48::nextf((Rand48 *)&local_148,-180.0,180.0);
    Imath_2_5::Euler<float>::setOrder((Euler<float> *)&local_78,Default);
    local_78.x[0][1] = (float)local_138 * 0.017453292;
    local_78.x[0][0] = (float)local_128 * 0.017453292;
    local_78.x[0][2] = (float)dVar10 * 0.017453292;
    pVVar4 = &local_f8;
    Imath_2_5::Euler<float>::toMatrix44((Matrix44<float> *)pVVar4,(Euler<float> *)&local_78);
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar10 = Imath_2_5::Rand48::nextf((Rand48 *)&local_148,-1e-07,1e-07);
        (*(float (*) [4])&pVVar4->x)[lVar6] =
             (float)((double)(*(float (*) [4])&pVVar4->x)[lVar6] + dVar10);
      }
      pVVar4 = (Vec3<float> *)&pVVar4[1].y;
    }
    local_b8.x[0][0] = local_f8.x;
    local_b8.x[0][1] = local_f8.y;
    local_b8.x[0][2] = local_f8.z;
    local_b8.x[0][3] = fStack_ec;
    local_b8.x[1][0] = local_e8[0];
    local_b8.x[1][1] = local_e8[1];
    local_b8.x[1][2] = afStack_e0[0];
    local_b8.x[1][3] = afStack_e0[1];
    local_b8.x[2][0] = local_d8[0];
    local_b8.x[2][1] = local_d8[1];
    local_b8.x[2][2] = afStack_d0[0];
    local_b8.x[2][3] = afStack_d0[1];
    local_b8.x[3][0] = local_c8[0];
    local_b8.x[3][1] = local_c8[1];
    local_b8.x[3][2] = afStack_c0[0];
    local_b8.x[3][3] = afStack_c0[1];
    testMatrix(&local_b8,matrixEulerMatrix,order);
  }
  local_110 = 0.0;
  for (local_108 = 0; (uint)local_108 < 0x168; local_108 = (ulong)((int)local_108 + 0x5a)) {
    dVar10 = local_110 * 0.017453292519943295;
    auVar12 = ZEXT416(0);
    for (uVar5 = 0; uVar5 < 0x168; uVar5 = uVar5 + 0x5a) {
      local_100 = auVar12._0_8_;
      local_138 = (double)CONCAT44(local_138._4_4_,(float)(local_100 * 0.017453292519943295));
      auVar11 = ZEXT416(0);
      for (uVar8 = 0; uVar8 < 0x168; uVar8 = uVar8 + 0x5a) {
        local_128 = (double)CONCAT44(local_128._4_4_,(float)(auVar11._0_8_ * 0.017453292519943295));
        Imath_2_5::Euler<float>::setOrder(&local_148,order);
        local_148.super_Vec3<float>.y = local_138._0_4_;
        local_148.super_Vec3<float>.z = local_128._0_4_;
        local_148.super_Vec3<float>.x = (float)dVar10;
        Imath_2_5::Euler<float>::toMatrix44((Matrix44<float> *)&local_f8,&local_148);
        local_b8.x[0][0] = local_f8.x;
        local_b8.x[0][1] = local_f8.y;
        local_b8.x[0][2] = local_f8.z;
        local_b8.x[0][3] = fStack_ec;
        local_b8.x[1][0] = local_e8[0];
        local_b8.x[1][1] = local_e8[1];
        local_b8.x[1][2] = afStack_e0[0];
        local_b8.x[1][3] = afStack_e0[1];
        local_b8.x[2][0] = local_d8[0];
        local_b8.x[2][1] = local_d8[1];
        local_b8.x[2][2] = afStack_d0[0];
        local_b8.x[2][3] = afStack_d0[1];
        local_b8.x[3][0] = local_c8[0];
        local_b8.x[3][1] = local_c8[1];
        local_b8.x[3][2] = afStack_c0[0];
        local_b8.x[3][3] = afStack_c0[1];
        testMatrix(&local_b8,matrixEulerMatrix,order);
        pVVar4 = &local_f8;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            fVar1 = (*(float (*) [4])&pVVar4->x)[lVar6];
            uVar9 = -(uint)(fVar1 < -0.5);
            (*(float (*) [4])&pVVar4->x)[lVar6] =
                 (float)(uVar9 & 0xbf800000 | ~uVar9 & -(uint)(0.5 < fVar1) & 0x3f800000);
          }
          pVVar4 = (Vec3<float> *)&pVVar4[1].y;
        }
        local_78.x[0][0] = local_f8.x;
        local_78.x[0][1] = local_f8.y;
        local_78.x[0][2] = local_f8.z;
        local_78.x[0][3] = fStack_ec;
        local_78.x[1][0] = local_e8[0];
        local_78.x[1][1] = local_e8[1];
        local_78.x[1][2] = afStack_e0[0];
        local_78.x[1][3] = afStack_e0[1];
        local_78.x[2][0] = local_d8[0];
        local_78.x[2][1] = local_d8[1];
        local_78.x[2][2] = afStack_d0[0];
        local_78.x[2][3] = afStack_d0[1];
        local_78.x[3][0] = local_c8[0];
        local_78.x[3][1] = local_c8[1];
        local_78.x[3][2] = afStack_c0[0];
        local_78.x[3][3] = afStack_c0[1];
        testMatrix(&local_78,matrixEulerMatrix,order);
        auVar11._0_8_ = auVar11._0_8_ + 90.0;
        auVar11._8_8_ = 0;
      }
      auVar12._0_8_ = local_100 + 90.0;
      auVar12._8_8_ = 0;
    }
    local_110 = local_110 + 90.0;
  }
  return;
}

Assistant:

void
test (M44f (*matrixEulerMatrix)(const M44f &, Eulerf::Order),
      Eulerf::Order order)
{
    cout << "order = " << setbase (16) << int (order) << setbase (10) << endl;

    // cout << "random angles" << endl;

    testRandomAngles (matrixEulerMatrix, order);

    // cout << "special angles" << endl;

    for (int i = 0; i < 360; i += 90)
	for (int j = 0; j < 360; j += 90)
	    for (int k = 0; k < 360; k += 90)
		testAngles (V3f (i, j, k), matrixEulerMatrix, order);
}